

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

longlong mkvparser::ReadID(IMkvReader *pReader,longlong pos,long *len)

{
  bool bVar1;
  int iVar2;
  long *in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  int i;
  longlong ebml_id;
  int id_length;
  bool found_bit;
  int kCheckByte;
  int kMaxIdLengthInBytes;
  int bit_pos;
  int read_status;
  uchar temp_byte;
  int local_4c;
  ulong local_48;
  int local_2c;
  byte local_21;
  long *local_20;
  long local_18;
  undefined8 *local_10;
  ulong local_8;
  
  if ((in_RDI == (undefined8 *)0x0) || (in_RSI < 0)) {
    local_8 = 0xfffffffffffffffe;
  }
  else {
    local_21 = 0;
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    iVar2 = (**(code **)*in_RDI)(in_RDI,in_RSI,1,&local_21);
    if (iVar2 < 0) {
      local_8 = 0xfffffffffffffffe;
    }
    else if (iVar2 < 1) {
      if (local_21 == 0) {
        local_8 = 0xfffffffffffffffe;
      }
      else {
        bVar1 = false;
        for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
          if ((0x80 >> ((byte)local_2c & 0x1f) & (uint)local_21) != 0) {
            bVar1 = true;
            break;
          }
        }
        if (bVar1) {
          local_48 = (ulong)local_21;
          for (local_4c = 1; local_4c < local_2c + 1; local_4c = local_4c + 1) {
            iVar2 = (**(code **)*local_10)(local_10,local_18 + local_4c,1,&local_21);
            if (iVar2 < 0) {
              return -2;
            }
            if (0 < iVar2) {
              return -3;
            }
            local_48 = (ulong)local_21 | local_48 << 8;
          }
          *local_20 = (long)(local_2c + 1);
          local_8 = local_48;
        }
        else {
          local_8 = 0xfffffffffffffffe;
        }
      }
    }
    else {
      local_8 = 0xfffffffffffffffd;
    }
  }
  return local_8;
}

Assistant:

long long ReadID(IMkvReader* pReader, long long pos, long& len) {
  if (pReader == NULL || pos < 0)
    return E_FILE_FORMAT_INVALID;

  // Read the first byte. The length in bytes of the ID is determined by
  // finding the first set bit in the first byte of the ID.
  unsigned char temp_byte = 0;
  int read_status = pReader->Read(pos, 1, &temp_byte);

  if (read_status < 0)
    return E_FILE_FORMAT_INVALID;
  else if (read_status > 0)  // No data to read.
    return E_BUFFER_NOT_FULL;

  if (temp_byte == 0)  // ID length > 8 bytes; invalid file.
    return E_FILE_FORMAT_INVALID;

  int bit_pos = 0;
  const int kMaxIdLengthInBytes = 4;
  const int kCheckByte = 0x80;

  // Find the first bit that's set.
  bool found_bit = false;
  for (; bit_pos < kMaxIdLengthInBytes; ++bit_pos) {
    if ((kCheckByte >> bit_pos) & temp_byte) {
      found_bit = true;
      break;
    }
  }

  if (!found_bit) {
    // The value is too large to be a valid ID.
    return E_FILE_FORMAT_INVALID;
  }

  // Read the remaining bytes of the ID (if any).
  const int id_length = bit_pos + 1;
  long long ebml_id = temp_byte;
  for (int i = 1; i < id_length; ++i) {
    ebml_id <<= 8;
    read_status = pReader->Read(pos + i, 1, &temp_byte);

    if (read_status < 0)
      return E_FILE_FORMAT_INVALID;
    else if (read_status > 0)
      return E_BUFFER_NOT_FULL;

    ebml_id |= temp_byte;
  }

  len = id_length;
  return ebml_id;
}